

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void __thiscall re2::Compiler::AddRuneRangeUTF8(Compiler *this,Rune lo,Rune hi,bool foldcase)

{
  int iVar1;
  undefined1 in_CL;
  uint in_EDX;
  int in_ESI;
  Compiler *in_RDI;
  Compiler *unaff_retaddr;
  int i_3;
  int i_2;
  int id;
  int m;
  int n;
  uint8_t uhi [4];
  uint8_t ulo [4];
  uint32_t m_1;
  int i_1;
  Rune max;
  int i;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  byte local_2c [4];
  int in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  int in_stack_ffffffffffffffe4;
  bool foldcase_00;
  int iVar3;
  undefined3 in_stack_ffffffffffffffec;
  uint lo_00;
  undefined1 uVar4;
  undefined1 foldcase_01;
  uint8_t hi_00;
  uint8_t lo_01;
  Compiler *this_00;
  
  uVar4 = (undefined1)in_ESI;
  foldcase_01 = (undefined1)((uint)in_ESI >> 8);
  hi_00 = (uint8_t)((uint)in_ESI >> 0x10);
  lo_01 = (uint8_t)((uint)in_ESI >> 0x18);
  lo_00 = CONCAT13(in_CL,in_stack_ffffffffffffffec) & 0x1ffffff;
  if (in_ESI <= (int)in_EDX) {
    if (((in_ESI == 0x80) && (in_EDX == 0x10ffff)) && ((in_RDI->reversed_ & 1U) == 0)) {
      Add_80_10ffff(unaff_retaddr);
    }
    else {
      this_00 = in_RDI;
      for (iVar3 = 1; iVar3 < 4; iVar3 = iVar3 + 1) {
        in_stack_ffffffffffffffe4 = MaxRune(iVar3);
        if ((CONCAT13(lo_01,CONCAT12(hi_00,CONCAT11(foldcase_01,uVar4))) <=
             in_stack_ffffffffffffffe4) && (in_stack_ffffffffffffffe4 < (int)in_EDX)) {
          AddRuneRangeUTF8((Compiler *)
                           CONCAT17(lo_01,CONCAT16(hi_00,CONCAT15(foldcase_01,CONCAT14(uVar4,in_EDX)
                                                                 ))),lo_00,iVar3,
                           SUB41((uint)in_stack_ffffffffffffffe4 >> 0x18,0));
          AddRuneRangeUTF8((Compiler *)
                           CONCAT17(lo_01,CONCAT16(hi_00,CONCAT15(foldcase_01,CONCAT14(uVar4,in_EDX)
                                                                 ))),lo_00,iVar3,
                           SUB41((uint)in_stack_ffffffffffffffe4 >> 0x18,0));
          return;
        }
      }
      if ((int)in_EDX < 0x80) {
        UncachedRuneByteSuffix
                  ((Compiler *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (uint8_t)(in_stack_ffffffffffffffdc >> 0x18),
                   (uint8_t)(in_stack_ffffffffffffffdc >> 0x10),
                   SUB41(in_stack_ffffffffffffffdc >> 8,0),in_stack_ffffffffffffffd8);
        AddSuffix((Compiler *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (int)((ulong)in_RDI >> 0x20));
      }
      else {
        for (iVar2 = 1; iVar2 < 4; iVar2 = iVar2 + 1) {
          in_stack_ffffffffffffffdc = (1 << ((char)iVar2 * '\x06' & 0x1fU)) - 1;
          if ((CONCAT13(lo_01,CONCAT12(hi_00,CONCAT11(foldcase_01,uVar4))) &
              (in_stack_ffffffffffffffdc ^ 0xffffffff)) !=
              (in_EDX & (in_stack_ffffffffffffffdc ^ 0xffffffff))) {
            foldcase_00 = SUB41((uint)in_stack_ffffffffffffffe4 >> 0x18,0);
            if ((CONCAT13(lo_01,CONCAT12(hi_00,CONCAT11(foldcase_01,uVar4))) &
                in_stack_ffffffffffffffdc) != 0) {
              AddRuneRangeUTF8((Compiler *)
                               CONCAT17(lo_01,CONCAT16(hi_00,CONCAT15(foldcase_01,
                                                                      CONCAT14(uVar4,in_EDX)))),
                               lo_00,iVar3,foldcase_00);
              AddRuneRangeUTF8((Compiler *)
                               CONCAT17(lo_01,CONCAT16(hi_00,CONCAT15(foldcase_01,
                                                                      CONCAT14(uVar4,in_EDX)))),
                               lo_00,iVar3,SUB41((uint)in_stack_ffffffffffffffe4 >> 0x18,0));
              return;
            }
            if ((in_EDX & in_stack_ffffffffffffffdc) != in_stack_ffffffffffffffdc) {
              AddRuneRangeUTF8((Compiler *)
                               CONCAT17(lo_01,CONCAT16(hi_00,CONCAT15(foldcase_01,
                                                                      CONCAT14(uVar4,in_EDX)))),
                               lo_00,iVar3,foldcase_00);
              AddRuneRangeUTF8((Compiler *)
                               CONCAT17(lo_01,CONCAT16(hi_00,CONCAT15(foldcase_01,
                                                                      CONCAT14(uVar4,in_EDX)))),
                               lo_00,iVar3,SUB41((uint)in_stack_ffffffffffffffe4 >> 0x18,0));
              return;
            }
          }
        }
        iVar1 = runetochar(&stack0xffffffffffffffd8,(Rune *)&stack0xfffffffffffffff4);
        runetochar((char *)local_2c,(Rune *)&stack0xfffffffffffffff0);
        iVar3 = iVar1;
        if ((in_RDI->reversed_ & 1U) == 0) {
          while( true ) {
            in_stack_ffffffffffffffc0 = iVar3 + -1;
            iVar3 = (int)((ulong)in_RDI >> 0x20);
            if (in_stack_ffffffffffffffc0 < 0) break;
            if ((in_stack_ffffffffffffffc0 == iVar1 + -1) ||
               (((byte)(&stack0xffffffffffffffd8)[in_stack_ffffffffffffffc0] <
                 local_2c[in_stack_ffffffffffffffc0] && (in_stack_ffffffffffffffc0 != 0)))) {
              CachedRuneByteSuffix(this_00,lo_01,hi_00,(bool)foldcase_01,in_EDX);
              iVar3 = in_stack_ffffffffffffffc0;
            }
            else {
              UncachedRuneByteSuffix
                        ((Compiler *)CONCAT44(in_stack_ffffffffffffffe4,iVar2),
                         (uint8_t)(in_stack_ffffffffffffffdc >> 0x18),
                         (uint8_t)(in_stack_ffffffffffffffdc >> 0x10),
                         SUB41(in_stack_ffffffffffffffdc >> 8,0),in_stack_ffffffffffffffd8);
              iVar3 = in_stack_ffffffffffffffc0;
            }
          }
        }
        else {
          for (in_stack_ffffffffffffffc4 = 0; iVar3 = (int)((ulong)in_RDI >> 0x20),
              in_stack_ffffffffffffffc4 < iVar1;
              in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
            if ((in_stack_ffffffffffffffc4 == 0) ||
               (((&stack0xffffffffffffffd8)[in_stack_ffffffffffffffc4] ==
                 local_2c[in_stack_ffffffffffffffc4] && (in_stack_ffffffffffffffc4 != iVar1 + -1))))
            {
              CachedRuneByteSuffix(this_00,lo_01,hi_00,(bool)foldcase_01,in_EDX);
            }
            else {
              UncachedRuneByteSuffix
                        ((Compiler *)CONCAT44(in_stack_ffffffffffffffe4,iVar2),
                         (uint8_t)(in_stack_ffffffffffffffdc >> 0x18),
                         (uint8_t)(in_stack_ffffffffffffffdc >> 0x10),
                         SUB41(in_stack_ffffffffffffffdc >> 8,0),in_stack_ffffffffffffffd8);
            }
          }
        }
        AddSuffix((Compiler *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),iVar3);
      }
    }
  }
  return;
}

Assistant:

void Compiler::AddRuneRangeUTF8(Rune lo, Rune hi, bool foldcase) {
  if (lo > hi)
    return;

  // Pick off 80-10FFFF as a common special case
  // that can bypass the slow rune_cache_.
  if (lo == 0x80 && hi == 0x10ffff && !reversed_) {
    Add_80_10ffff();
    return;
  }

  // Split range into same-length sized ranges.
  for (int i = 1; i < UTFmax; i++) {
    Rune max = MaxRune(i);
    if (lo <= max && max < hi) {
      AddRuneRangeUTF8(lo, max, foldcase);
      AddRuneRangeUTF8(max+1, hi, foldcase);
      return;
    }
  }

  // ASCII range is always a special case.
  if (hi < Runeself) {
    AddSuffix(UncachedRuneByteSuffix(static_cast<uint8_t>(lo),
                                     static_cast<uint8_t>(hi), foldcase, 0));
    return;
  }

  // Split range into sections that agree on leading bytes.
  for (int i = 1; i < UTFmax; i++) {
    uint32_t m = (1<<(6*i)) - 1;  // last i bytes of a UTF-8 sequence
    if ((lo & ~m) != (hi & ~m)) {
      if ((lo & m) != 0) {
        AddRuneRangeUTF8(lo, lo|m, foldcase);
        AddRuneRangeUTF8((lo|m)+1, hi, foldcase);
        return;
      }
      if ((hi & m) != m) {
        AddRuneRangeUTF8(lo, (hi&~m)-1, foldcase);
        AddRuneRangeUTF8(hi&~m, hi, foldcase);
        return;
      }
    }
  }

  // Finally.  Generate byte matching equivalent for lo-hi.
  uint8_t ulo[UTFmax], uhi[UTFmax];
  int n = runetochar(reinterpret_cast<char*>(ulo), &lo);
  int m = runetochar(reinterpret_cast<char*>(uhi), &hi);
  (void)m;  // USED(m)
  DCHECK_EQ(n, m);

  // The logic below encodes this thinking:
  //
  // 1. When we have built the whole suffix, we know that it cannot
  // possibly be a suffix of anything longer: in forward mode, nothing
  // else can occur before the leading byte; in reverse mode, nothing
  // else can occur after the last continuation byte or else the leading
  // byte would have to change. Thus, there is no benefit to caching
  // the first byte of the suffix whereas there is a cost involved in
  // cloning it if it begins a common prefix, which is fairly likely.
  //
  // 2. Conversely, the last byte of the suffix cannot possibly be a
  // prefix of anything because next == 0, so we will never want to
  // clone it, but it is fairly likely to be a common suffix. Perhaps
  // more so in reverse mode than in forward mode because the former is
  // "converging" towards lower entropy, but caching is still worthwhile
  // for the latter in cases such as 80-BF.
  //
  // 3. Handling the bytes between the first and the last is less
  // straightforward and, again, the approach depends on whether we are
  // "converging" towards lower entropy: in forward mode, a single byte
  // is unlikely to be part of a common suffix whereas a byte range
  // is more likely so; in reverse mode, a byte range is unlikely to
  // be part of a common suffix whereas a single byte is more likely
  // so. The same benefit versus cost argument applies here.
  int id = 0;
  if (reversed_) {
    for (int i = 0; i < n; i++) {
      // In reverse UTF-8 mode: cache the leading byte; don't cache the last
      // continuation byte; cache anything else iff it's a single byte (XX-XX).
      if (i == 0 || (ulo[i] == uhi[i] && i != n-1))
        id = CachedRuneByteSuffix(ulo[i], uhi[i], false, id);
      else
        id = UncachedRuneByteSuffix(ulo[i], uhi[i], false, id);
    }
  } else {
    for (int i = n-1; i >= 0; i--) {
      // In forward UTF-8 mode: don't cache the leading byte; cache the last
      // continuation byte; cache anything else iff it's a byte range (XX-YY).
      if (i == n-1 || (ulo[i] < uhi[i] && i != 0))
        id = CachedRuneByteSuffix(ulo[i], uhi[i], false, id);
      else
        id = UncachedRuneByteSuffix(ulo[i], uhi[i], false, id);
    }
  }
  AddSuffix(id);
}